

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

bool __thiscall
cmdline::parser::option_with_value<bool>::set(option_with_value<bool> *this,string *value)

{
  int iVar1;
  exception *e;
  string *value_local;
  option_with_value<bool> *this_local;
  
  iVar1 = (*(this->super_option_base)._vptr_option_base[0xc])(this,value);
  this->actual = (bool)((byte)iVar1 & 1);
  this->has = true;
  return true;
}

Assistant:

bool set(const std::string &value){
                        try
                        {
                            actual = read(value);
                            has = true;
                        }
                        catch(
                        const std::exception
                        &e){
                            return false;
                        }
                        return true;
                    }